

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall Json::Value::CZString::operator<(CZString *this,CZString *other)

{
  int iVar1;
  uint *puVar2;
  int comp;
  allocator local_51;
  string local_50;
  uint local_2c;
  uint local_28;
  uint min_len;
  uint other_len;
  uint this_len;
  CZString *other_local;
  CZString *this_local;
  
  if (this->cstr_ == (char *)0x0) {
    this_local._7_1_ = (this->field_1).index_ < (other->field_1).index_;
  }
  else {
    min_len = (this->field_1).index_ >> 2;
    local_28 = (other->field_1).index_ >> 2;
    _other_len = other;
    other_local = this;
    puVar2 = std::min<unsigned_int>(&min_len,&local_28);
    local_2c = *puVar2;
    if ((this->cstr_ == (char *)0x0) || (_other_len->cstr_ == (char *)0x0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_50,"assert json failed",&local_51);
      throwLogicError(&local_50);
    }
    iVar1 = memcmp(this->cstr_,_other_len->cstr_,(ulong)local_2c);
    if (iVar1 < 0) {
      this_local._7_1_ = true;
    }
    else if (iVar1 < 1) {
      this_local._7_1_ = min_len < local_28;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Value::CZString::operator<(const CZString& other) const {
  if (!cstr_) return index_ < other.index_;
  //return strcmp(cstr_, other.cstr_) < 0;
  // Assume both are strings.
  unsigned this_len = this->storage_.length_;
  unsigned other_len = other.storage_.length_;
  unsigned min_len = std::min(this_len, other_len);
  JSON_ASSERT(this->cstr_ && other.cstr_);
  int comp = memcmp(this->cstr_, other.cstr_, min_len);
  if (comp < 0) return true;
  if (comp > 0) return false;
  return (this_len < other_len);
}